

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Types.hpp
# Opt level: O0

char * __thiscall Doublet::index(Doublet *this,char *__s,int __c)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  int __c_00;
  undefined4 in_stack_fffffffffffffff4;
  
  pcVar3 = Gaussian::index(&this->left,__s,__c);
  iVar2 = (int)pcVar3;
  iVar1 = Gaussian::ncart((Gaussian *)CONCAT44(in_stack_fffffffffffffff4,iVar2));
  iVar2 = iVar2 * iVar1;
  pcVar3 = Gaussian::index(&this->right,__s,__c_00);
  return (char *)(ulong)(uint)(iVar2 + (int)pcVar3);
}

Assistant:

int index(void) const { return left.index() * right.ncart() + right.index(); }